

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuDevice.cpp
# Opt level: O0

void amrex::Gpu::Device::mem_advise_set_preferred(void *p,size_t sz,int device)

{
  int device_local;
  size_t sz_local;
  void *p_local;
  
  return;
}

Assistant:

void
Device::mem_advise_set_preferred (void* p, const std::size_t sz, const int device)
{
    amrex::ignore_unused(p,sz,device);
#if defined(AMREX_USE_CUDA) || defined(AMREX_USE_HIP)
    if (device_prop.managedMemory == 1 && device_prop.concurrentManagedAccess == 1)
    {
        AMREX_HIP_OR_CUDA
            (AMREX_HIP_SAFE_CALL(
                 hipMemAdvise(p, sz, hipMemAdviseSetPreferredLocation, device)),
             AMREX_CUDA_SAFE_CALL(
                 cudaMemAdvise(p, sz, cudaMemAdviseSetPreferredLocation, device)));
    }
#elif defined(AMREX_USE_DPCPP)
    // xxxxx DPCPP todo: mem_advise
    // if (device_prop.managedMemory == 1 && device_prop.concurrentManagedAccess == 1)
    // {
    //     auto& q = Gpu::Device::streamQueue();
    //     q.mem_advise(p, sz, PI_MEM_ADVICE_SET_PREFERRED_LOCATION);
    // }
#endif
}